

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cubeb_pulse.c
# Opt level: O3

pa_buffer_attr *
set_buffering_attribute
          (pa_buffer_attr *__return_storage_ptr__,uint latency_frames,pa_sample_spec *sample_spec)

{
  uint uVar1;
  size_t sVar2;
  pa_buffer_attr *ppVar3;
  uint uVar4;
  
  __return_storage_ptr__->maxlength = 0xffffffff;
  __return_storage_ptr__->prebuf = 0xffffffff;
  sVar2 = (*cubeb_pa_frame_size)(sample_spec);
  uVar1 = (int)sVar2 * latency_frames;
  ppVar3 = (pa_buffer_attr *)(ulong)uVar1;
  __return_storage_ptr__->tlength = uVar1;
  uVar4 = uVar1 >> 2;
  __return_storage_ptr__->minreq = uVar4;
  __return_storage_ptr__->fragsize = uVar4;
  if ((g_cubeb_log_callback != (cubeb_log_callback)0x0) && (g_cubeb_log_level != CUBEB_LOG_DISABLED)
     ) {
    ppVar3 = (pa_buffer_attr *)
             (*g_cubeb_log_callback)
                       ("%s:%d: Requested buffer attributes maxlength %u, tlength %u, prebuf %u, minreq %u, fragsize %u\n"
                        ,"cubeb_pulse.c",0x397,0xffffffff,(ulong)uVar1,0xffffffff,(ulong)uVar4,
                        (ulong)uVar4);
  }
  return ppVar3;
}

Assistant:

static pa_buffer_attr
set_buffering_attribute(unsigned int latency_frames,
                        pa_sample_spec * sample_spec)
{
  pa_buffer_attr battr;
  battr.maxlength = -1;
  battr.prebuf = -1;
  battr.tlength = latency_frames * WRAP(pa_frame_size)(sample_spec);
  battr.minreq = battr.tlength / 4;
  battr.fragsize = battr.minreq;

  LOG("Requested buffer attributes maxlength %u, tlength %u, prebuf %u, minreq "
      "%u, fragsize %u",
      battr.maxlength, battr.tlength, battr.prebuf, battr.minreq,
      battr.fragsize);

  return battr;
}